

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O0

void * XlatParseAlloc(_func_void_ptr_size_t *mallocProc)

{
  long *plVar1;
  yyParser *pParser;
  _func_void_ptr_size_t *mallocProc_local;
  
  plVar1 = (long *)(*mallocProc)(0x2278);
  if (plVar1 != (long *)0x0) {
    *(undefined4 *)(plVar1 + 1) = 0xffffffff;
    *plVar1 = (long)(plVar1 + 3);
    *(undefined2 *)(plVar1 + 3) = 0;
    *(undefined1 *)((long)plVar1 + 0x1a) = 0;
  }
  return plVar1;
}

Assistant:

void *XlatParseAlloc(void *(CDECL *mallocProc)(YYMALLOCARGTYPE)){
  yyParser *pParser;
  pParser = (yyParser*)(*mallocProc)( (YYMALLOCARGTYPE)sizeof(yyParser) );
  if( pParser ){
#ifdef YYTRACKMAXSTACKDEPTH
    pParser->yyhwm = 0;
#endif
#if YYSTACKDEPTH<=0
    pParser->yytos = NULL;
    pParser->yystack = NULL;
    pParser->yystksz = 0;
    if( yyGrowStack(pParser) ){
      pParser->yystack = &pParser->yystk0;
      pParser->yystksz = 1;
    }
#endif
#ifndef YYNOERRORRECOVERY
    pParser->yyerrcnt = -1;
#endif
    pParser->yytos = pParser->yystack;
    pParser->yystack[0].stateno = 0;
    pParser->yystack[0].major = 0;
  }
  return pParser;
}